

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O2

bool __thiscall HighsIis::trivial(HighsIis *this,HighsLp *lp,HighsOptions *options)

{
  int *piVar1;
  double *pdVar2;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar9;
  HighsInt status;
  long lVar10;
  bool bVar11;
  HighsInt k;
  uint uVar12;
  ulong uVar13;
  HighsInt iRow;
  double dVar14;
  value_type_conflict2 local_4c;
  vector<int,_std::allocator<int>_> count;
  int iVar8;
  
  invalidate(this);
  iVar5 = (options->super_HighsOptionsStruct).iis_strategy;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    dVar14 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
    dVar14 = dVar14 + dVar14;
    if (uVar12 == (iVar5 != 1)) {
      uVar6 = (ulong)(uint)lp->num_col_;
      if (lp->num_col_ < 1) {
        uVar6 = 0;
      }
      for (uVar13 = 0; uVar6 != uVar13; uVar13 = uVar13 + 1) {
        if (dVar14 < (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13] -
                     (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13]) {
          addCol(this,(HighsInt)uVar13,4);
          break;
        }
      }
      if ((this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) break;
    }
    else {
      uVar6 = (ulong)(uint)lp->num_row_;
      if (lp->num_row_ < 1) {
        uVar6 = 0;
      }
      for (uVar13 = 0; uVar6 != uVar13; uVar13 = uVar13 + 1) {
        if (dVar14 < (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13] -
                     (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13]) {
          addRow(this,(HighsInt)uVar13,4);
          break;
        }
      }
      if ((this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) break;
    }
  }
  iVar5 = (int)((ulong)((long)(this->col_index_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->col_index_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2);
  iVar8 = (int)((ulong)((long)(this->row_index_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->row_index_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2);
  iVar7 = iVar8 + iVar5;
  if (iVar7 == 0 || SCARRY4(iVar8,iVar5) != iVar7 < 0) {
    count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_4c = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign(&count,(long)lp->num_row_,&local_4c);
    piVar3 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    while (lVar9 < lp->num_col_) {
      piVar1 = piVar3 + lVar9;
      lVar9 = lVar9 + 1;
      piVar4 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar10 = (long)*piVar1; lVar10 < piVar3[lVar9]; lVar10 = lVar10 + 1) {
        count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [piVar4[lVar10]] =
             count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[piVar4[lVar10]] + 1;
      }
    }
    for (lVar9 = 0; bVar11 = lVar9 < lp->num_row_, lVar9 < lp->num_row_; lVar9 = lVar9 + 1) {
      if (count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar9] < 1) {
        dVar14 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
        status = 2;
        if ((dVar14 < (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar9]) ||
           (dVar14 = -dVar14,
           pdVar2 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar9, status = 3,
           *pdVar2 <= dVar14 && dVar14 != *pdVar2)) {
          addRow(this,(HighsInt)lVar9,status);
        }
        if ((this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          this->valid_ = true;
          this->strategy_ = (options->super_HighsOptionsStruct).iis_strategy;
          break;
        }
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&count.super__Vector_base<int,_std::allocator<int>_>);
  }
  else {
    this->valid_ = true;
    this->strategy_ = (options->super_HighsOptionsStruct).iis_strategy;
    bVar11 = true;
  }
  return bVar11;
}

Assistant:

bool HighsIis::trivial(const HighsLp& lp, const HighsOptions& options) {
  this->invalidate();
  const bool col_priority =
      //      options.iis_strategy == kIisStrategyFromRayColPriority ||
      options.iis_strategy == kIisStrategyFromLpColPriority;
  for (HighsInt k = 0; k < 2; k++) {
    if ((col_priority && k == 0) || (!col_priority && k == 1)) {
      // Loop over columns first
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
        if (lp.col_lower_[iCol] - lp.col_upper_[iCol] >
            2 * options.primal_feasibility_tolerance) {
          this->addCol(iCol, kIisBoundStatusBoxed);
          break;
        }
      }
      if (this->col_index_.size() > 0) break;
    } else {
      // Loop over rows first
      for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
        if (lp.row_lower_[iRow] - lp.row_upper_[iRow] >
            2 * options.primal_feasibility_tolerance) {
          this->addRow(iRow, kIisBoundStatusBoxed);
          break;
        }
      }
      if (this->row_index_.size() > 0) break;
    }
  }
  HighsInt num_iis_col = this->col_index_.size();
  HighsInt num_iis_row = this->row_index_.size();
  // If one is found then we're done
  if (num_iis_col + num_iis_row > 0) {
    // Should have found exactly 1
    assert((num_iis_col == 1 || num_iis_row == 1) &&
           num_iis_col + num_iis_row < 2);
    this->valid_ = true;
    this->strategy_ = options.iis_strategy;
    return true;
  }
  // Now look for empty rows that cannot have zero activity
  std::vector<HighsInt> count;
  count.assign(lp.num_row_, 0);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    for (HighsInt iEl = lp.a_matrix_.start_[iCol];
         iEl < lp.a_matrix_.start_[iCol + 1]; iEl++)
      count[lp.a_matrix_.index_[iEl]]++;
  }
  assert(this->row_index_.size() == 0);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (count[iRow] > 0) continue;
    if (lp.row_lower_[iRow] > options.primal_feasibility_tolerance) {
      this->addRow(iRow, kIisBoundStatusLower);
    } else if (lp.row_upper_[iRow] < -options.primal_feasibility_tolerance) {
      this->addRow(iRow, kIisBoundStatusUpper);
    }
    if (this->row_index_.size() > 0) {
      this->valid_ = true;
      this->strategy_ = options.iis_strategy;
      return true;
    }
  }
  return false;
}